

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::TexelFetchDecodeSkippedcase::verifyResult
          (TexelFetchDecodeSkippedcase *this)

{
  bool bVar1;
  TestContext *this_00;
  TestLog *this_01;
  reference pvVar2;
  MessageBuilder *pMVar3;
  bool local_459;
  allocator<char> local_441;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  MessageBuilder local_420;
  undefined4 local_2a0;
  allocator<char> local_299;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  MessageBuilder local_278;
  Vector<bool,_4> local_f4;
  Vector<float,_4> local_f0;
  Vector<float,_4> local_e0;
  Vector<bool,_4> local_d0;
  Vector<float,_4> local_cc;
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_88 [16];
  undefined1 auStack_78 [8];
  Vec4 pixelExpected;
  _func_int **pp_Stack_58;
  Vec4 pixelReference;
  undefined1 local_40 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> pixelResultList;
  int resultColorIdx;
  TestLog *log;
  TexelFetchDecodeSkippedcase *this_local;
  
  this_00 = Context::getTestContext((this->super_SRGBTestCase).super_TestCase.m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  pixelResultList.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_40);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&pp_Stack_58);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)auStack_78);
  SRGBTestCase::readResultTextures(&this->super_SRGBTestCase);
  SRGBTestCase::storeResultPixels
            (&this->super_SRGBTestCase,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_40);
  getColorReferenceLinear();
  SRGBTestCase::formatReferenceColor((SRGBTestCase *)local_88,(Vec4 *)this);
  auStack_78 = (undefined1  [8])local_88._0_8_;
  pixelExpected.m_data[0] = (float)local_88._8_4_;
  pixelExpected.m_data[1] = (float)local_88._12_4_;
  pp_Stack_58 = (_func_int **)local_88._0_8_;
  pixelReference.m_data[0] = (float)local_88._8_4_;
  pixelReference.m_data[1] = (float)local_88._12_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"Expected color: ",&local_b9);
  tcu::Vector<float,_4>::Vector(&local_cc,(Vector<float,_4> *)auStack_78);
  SRGBTestCase::logColor(&this->super_SRGBTestCase,&local_b8,0,&local_cc);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  pvVar2 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_40,0);
  tcu::operator-((tcu *)&local_f0,pvVar2,(Vector<float,_4> *)&pp_Stack_58);
  tcu::abs<float,4>((tcu *)&local_e0,&local_f0);
  tcu::lessThan<float,4>((tcu *)&local_d0,&local_e0,&(this->super_SRGBTestCase).m_epsilonError);
  bVar1 = tcu::boolAll<4>(&local_d0);
  local_459 = true;
  if (!bVar1) {
    pvVar2 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_40,0);
    tcu::equal<float,4>((tcu *)&local_f4,pvVar2,(Vector<float,_4> *)&pp_Stack_58);
    local_459 = tcu::boolAll<4>(&local_f4);
  }
  if (local_459 != false) {
    tcu::TestLog::operator<<(&local_278,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,"linear as expected",&local_299);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_278,&local_298);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator(&local_299);
    tcu::MessageBuilder::~MessageBuilder(&local_278);
  }
  else {
    tcu::TestLog::operator<<(&local_420,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_440,"not linear as expected",&local_441);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_420,&local_440);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_440);
    std::allocator<char>::~allocator(&local_441);
    tcu::MessageBuilder::~MessageBuilder(&local_420);
  }
  local_2a0 = 1;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_40);
  return local_459 != false;
}

Assistant:

bool TexelFetchDecodeSkippedcase::verifyResult (void)
{
	tcu::TestLog&			log				= m_context.getTestContext().getLog();
	const int				resultColorIdx	= 0;
	std::vector<tcu::Vec4>	pixelResultList;
	tcu::Vec4				pixelReference;
	tcu::Vec4				pixelExpected;

	this->readResultTextures();
	this->storeResultPixels(pixelResultList);

	pixelReference = pixelExpected = this->formatReferenceColor(getColorReferenceLinear());

	this->logColor(std::string("Expected color: "), resultColorIdx, pixelExpected);

	// result color 0 should be linear due to automatic conversion via texelFetch*(). Compare with linear reference color
	if ( (tcu::boolAll(tcu::lessThan(tcu::abs(pixelResultList[0] - pixelReference), m_epsilonError))) || (tcu::boolAll(tcu::equal(pixelResultList[0], pixelReference))) )
	{
		log << tcu::TestLog::Message << std::string("linear as expected") << tcu::TestLog::EndMessage;
		return true;
	}
	else
	{
		log << tcu::TestLog::Message << std::string("not linear as expected") << tcu::TestLog::EndMessage;
		return false;
	}
}